

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sptr_t file_read(char *path,char *mode)

{
  FILE *__stream;
  size_t size;
  size_t sVar1;
  uchar *__ptr;
  sptr_t sVar2;
  
  sVar1 = 0;
  __ptr = (uchar *)0x0;
  if (mode != (char *)0x0 && path != (char *)0x0) {
    __stream = fopen(path,mode);
    if (__stream == (FILE *)0x0) {
      perror("Unable to open file for reading\n");
      sVar1 = 0;
      fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
      __ptr = (uchar *)0x0;
    }
    else {
      fseek(__stream,0,2);
      size = ftell(__stream);
      fseek(__stream,0,0);
      __ptr = (uchar *)xmalloc(size);
      sVar1 = fread(__ptr,1,size,__stream);
      if (sVar1 == 0) {
        file_read_cold_1();
        __ptr = (uchar *)0x0;
      }
      else if (size != sVar1) {
        fprintf(_stderr,"Warning: only %lld of %lld bytes read from \"%s\"\n",sVar1,size,path);
      }
      fclose(__stream);
    }
  }
  sVar2.size = sVar1;
  sVar2.ptr = __ptr;
  return sVar2;
}

Assistant:

sptr_t file_read(const char *path, const char *mode)
{
	sptr_t result = SPTR_NULL;
	if (path == NULL || mode == NULL) {
		return result;
	}
	FILE *f = fopen(path, mode);
	if (!f) {
		perror("Unable to open file for reading\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		return result;
	}
	fseek(f, 0, SEEK_END);
	size_t fsize = ftell(f);
	fseek(f, 0, SEEK_SET);

	unsigned char *data = xmalloc(fsize);
	size_t total = fread(data, 1, fsize, f);
	if (total) {
		result.ptr = data;
		result.size = total;
		if (fsize != total) {
			fprintf(stderr, "Warning: only %lld of %lld bytes read from \"%s\"\n", total, fsize, path);
		}
	} else {
		perror("Unable to read file\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		if (ferror(f)) {
			fprintf(stderr, "IO error %d\n", ferror(f));
		} else if (feof(f)) {
			fprintf(stderr, "Unexpected EOF\n");
		}
		free(data);
		total = 0;
		data = NULL;
		goto end;
	}
end:
	fclose(f);
	return result;
}